

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O0

void SudokuGitter::printCellVec(vector<cell,_std::allocator<cell>_> *vec,string *name)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_1c;
  uint i;
  string *name_local;
  vector<cell,_std::allocator<cell>_> *vec_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::operator<<(poVar1,": ");
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<cell,_std::allocator<cell>_>::size(vec);
    if (sVar2 <= local_1c) break;
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    pvVar3 = std::vector<cell,_std::allocator<cell>_>::operator[](vec,(ulong)local_1c);
    std::ostream::operator<<(poVar1,pvVar3->value);
    local_1c = local_1c + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SudokuGitter::printCellVec(vector<cell> vec, string name) {
    // Print Original Vector
    std::cout << name << ": ";
    for (unsigned int i = 0; i < vec.size(); i++)
        std::cout << " " << vec[i].value;

    std::cout << std::endl;
}